

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

int json_object_update_existing(json_t *object,json_t *other)

{
  void *pvVar1;
  char *key;
  json_t *value;
  int iVar2;
  json_object_t *object_1;
  
  iVar2 = -1;
  if ((((object != (json_t *)0x0) && (other != (json_t *)0x0)) && (object->type == JSON_OBJECT)) &&
     (other->type == JSON_OBJECT)) {
    pvVar1 = hashtable_iter((hashtable_t *)(other + 1));
    iVar2 = 0;
    if (pvVar1 == (void *)0x0) {
      key = (char *)0x0;
    }
    else {
      key = (char *)hashtable_iter_key(pvVar1);
    }
    if (key != (char *)0x0) {
      iVar2 = 0;
      do {
        value = (json_t *)hashtable_iter_value(key + -0x20);
        if (value == (json_t *)0x0) {
          return 0;
        }
        if ((object->type == JSON_OBJECT) &&
           (pvVar1 = hashtable_get((hashtable_t *)(object + 1),key), pvVar1 != (void *)0x0)) {
          if (value->refcount != 0xffffffffffffffff) {
            value->refcount = value->refcount + 1;
          }
          json_object_set_new_nocheck(object,key,value);
        }
        if (other->type == JSON_OBJECT) {
          pvVar1 = hashtable_iter_next((hashtable_t *)(other + 1),key + -0x20);
        }
        else {
          pvVar1 = (void *)0x0;
        }
        if (pvVar1 == (void *)0x0) {
          key = (char *)0x0;
        }
        else {
          key = (char *)hashtable_iter_key(pvVar1);
        }
      } while (key != (char *)0x0);
    }
  }
  return iVar2;
}

Assistant:

int json_object_update_existing(json_t *object, json_t *other)
{
	const char *key;
	json_t *value;

	if (!json_is_object(object) || !json_is_object(other))
		return -1;

	json_object_foreach(other, key, value) {
		if (json_object_get(object, key))
			json_object_set_nocheck(object, key, value);
	}

	return 0;
}